

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

MaskImage * __thiscall
DataSourceBase::separate_sprites
          (MaskImage *__return_storage_ptr__,DataSourceBase *this,PSprite *s1,PSprite *s2)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<Data::Sprite> local_b8;
  shared_ptr<Data::Sprite> local_a8;
  shared_ptr<Data::Sprite> local_98;
  undefined1 local_88 [8];
  PSprite masked;
  shared_ptr<Data::Sprite> local_68;
  undefined1 local_58 [8];
  PSprite filled;
  void *local_40;
  tuple<std::nullptr_t,_std::nullptr_t> local_38;
  PSprite *local_28;
  PSprite *s2_local;
  PSprite *s1_local;
  DataSourceBase *this_local;
  
  local_28 = s2;
  s2_local = s1;
  s1_local = (PSprite *)this;
  this_local = (DataSourceBase *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)s1);
  if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)s2), bVar1)) {
    peVar2 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s1);
    std::shared_ptr<Data::Sprite>::shared_ptr(&local_68,s2);
    (*peVar2->_vptr_Sprite[8])(local_58,peVar2,&local_68);
    std::shared_ptr<Data::Sprite>::~shared_ptr(&local_68);
    peVar2 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s1);
    std::shared_ptr<Data::Sprite>::shared_ptr(&local_98,(shared_ptr<Data::Sprite> *)local_58);
    (*peVar2->_vptr_Sprite[7])(local_88,peVar2,&local_98);
    std::shared_ptr<Data::Sprite>::~shared_ptr(&local_98);
    peVar2 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    (*peVar2->_vptr_Sprite[0xe])();
    peVar2 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s1);
    std::shared_ptr<Data::Sprite>::shared_ptr(&local_a8,(shared_ptr<Data::Sprite> *)local_58);
    (*peVar2->_vptr_Sprite[0xc])(peVar2,&local_a8);
    std::shared_ptr<Data::Sprite>::~shared_ptr(&local_a8);
    peVar2 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s1);
    std::shared_ptr<Data::Sprite>::shared_ptr(&local_b8,(shared_ptr<Data::Sprite> *)local_88);
    (*peVar2->_vptr_Sprite[0xf])(peVar2,&local_b8,0);
    std::shared_ptr<Data::Sprite>::~shared_ptr(&local_b8);
    std::make_tuple<std::shared_ptr<Data::Sprite>&,std::shared_ptr<Data::Sprite>&>
              (__return_storage_ptr__,(shared_ptr<Data::Sprite> *)local_58,s1);
    std::shared_ptr<Data::Sprite>::~shared_ptr((shared_ptr<Data::Sprite> *)local_88);
    std::shared_ptr<Data::Sprite>::~shared_ptr((shared_ptr<Data::Sprite> *)local_58);
  }
  else {
    local_40 = (void *)0x0;
    filled.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::make_tuple<decltype(nullptr),decltype(nullptr)>((void **)&local_38,&local_40);
    std::tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>::
    tuple<std::nullptr_t,_std::nullptr_t,_true>(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Data::MaskImage
DataSourceBase::separate_sprites(Data::PSprite s1, Data::PSprite s2) {
  if (!s1 || !s2) {
    return std::make_tuple(nullptr, nullptr);
  }

  Data::PSprite filled = s1->create_mask(s2);
  Data::PSprite masked = s1->get_masked(filled);
  masked->make_alpha_mask();
  s1->del(filled);
  s1->stick(masked, 0, 0);

  return std::make_tuple(filled, s1);
}